

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

Type __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::generateSingleType(HeapTypeGeneratorImpl *this)

{
  Random *this_00;
  uint32_t uVar1;
  BasicType BVar2;
  Nullability NVar3;
  FeatureOptions<wasm::Type::BasicType> *pFVar4;
  Type TVar5;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
  local_48;
  
  uVar1 = Random::upTo(this->rand,2);
  if (uVar1 == 1) {
    uVar1 = Random::upTo(this->rand,4);
    if (uVar1 == 0) {
      NVar3 = generateBasicHeapType(this);
    }
    else {
      Random::upTo(this->rand,
                   (this->recGroupEnds).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[this->index]);
      NVar3 = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
    }
    Random::upTo(this->rand,2);
    TVar5.id = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,NVar3);
    return (Type)TVar5.id;
  }
  if (uVar1 == 0) {
    this_00 = this->rand;
    local_48._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48._M_impl.super__Rb_tree_header._M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl._0_8_ = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar4 = Random::FeatureOptions<wasm::Type::BasicType>::
             add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                       ((FeatureOptions<wasm::Type::BasicType> *)&local_48,(FeatureSet)0x0,i32,i64,
                        f32,f64);
    pFVar4 = Random::FeatureOptions<wasm::Type::BasicType>::add<>(pFVar4,(FeatureSet)0x8,v128);
    BVar2 = Random::pick<wasm::Type::BasicType>(this_00,pFVar4);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
    ::~_Rb_tree(&local_48);
    return (Type)(ulong)BVar2;
  }
  wasm::handle_unreachable
            ("unexpected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
             ,0xc5);
}

Assistant:

Type generateSingleType() {
    switch (rand.upTo(2)) {
      case 0:
        return generateBasicType();
      case 1:
        return generateRefType();
    }
    WASM_UNREACHABLE("unexpected");
  }